

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

ArrayIndex __thiscall Json::Value::size(Value *this)

{
  ArrayIndex AVar1;
  long lVar2;
  
  if (this->field_0x8 == '\a') {
    AVar1 = (ArrayIndex)(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    AVar1 = 0;
    if ((this->field_0x8 == '\x06') &&
       ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      lVar2 = std::_Rb_tree_decrement
                        (&(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header);
      return *(int *)(lVar2 + 0x28) + 1;
    }
  }
  return AVar1;
}

Assistant:

ArrayIndex Value::size() const {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
  case stringValue:
    return 0;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue: // size of the array is highest index + 1
    if (!value_.map_->empty()) {
      ObjectValues::const_iterator itLast = value_.map_->end();
      --itLast;
      return (*itLast).first.index() + 1;
    }
    return 0;
  case objectValue:
    return ArrayIndex(value_.map_->size());
#else
  case arrayValue:
    return Int(value_.array_->size());
  case objectValue:
    return Int(value_.map_->size());
#endif
  }
  JSON_ASSERT_UNREACHABLE;
  return 0; // unreachable;
}